

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkInOutConeCounters
               (Abc_Ntk_t *pNtk,Vec_Int_t *vFan,Vec_Int_t *vFon,Vec_Int_t *vFanR,Vec_Int_t *vFonR)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar3;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  int Addition;
  int Addition_00;
  
  p = Abc_NtkCollectCoCones(pNtk,1);
  p_00 = Abc_NtkCollectCiCones(pNtk,1);
  iVar1 = Vec_IntFindMax(p);
  iVar2 = Vec_IntFindMax(p_00);
  Vec_IntFill(vFan,iVar1 + 1,Fill);
  Vec_IntFill(vFon,iVar2 + 1,Fill_00);
  Vec_IntFill(vFanR,iVar1 + 1,Fill_01);
  Vec_IntFill(vFonR,iVar2 + 1,Fill_02);
  for (iVar1 = 0; iVar1 < pNtk->vCos->nSize; iVar1 = iVar1 + 1) {
    pAVar3 = Abc_NtkCo(pNtk,iVar1);
    iVar2 = Vec_IntEntry(p,iVar1);
    Vec_IntAddToEntry(vFan,iVar2,Addition);
    Vec_IntWriteEntry(vFanR,iVar2,pAVar3->Id);
  }
  for (iVar1 = 0; iVar1 < pNtk->vCis->nSize; iVar1 = iVar1 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,iVar1);
    iVar2 = Vec_IntEntry(p_00,iVar1);
    Vec_IntAddToEntry(vFon,iVar2,Addition_00);
    Vec_IntWriteEntry(vFonR,iVar2,pAVar3->Id);
  }
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Abc_NtkInOutConeCounters( Abc_Ntk_t * pNtk, Vec_Int_t * vFan, Vec_Int_t * vFon, Vec_Int_t * vFanR, Vec_Int_t * vFonR )
{
    Abc_Obj_t * pNode;
    Vec_Int_t * vSuppsCo = Abc_NtkCollectCoCones( pNtk, 1 );
    Vec_Int_t * vSuppsCi = Abc_NtkCollectCiCones( pNtk, 1 );
    int i, nFanins, nFanouts;
    int nFaninsMax  = Vec_IntFindMax( vSuppsCo );
    int nFanoutsMax = Vec_IntFindMax( vSuppsCi );
    Vec_IntFill( vFan, nFaninsMax + 1, 0 );
    Vec_IntFill( vFon, nFanoutsMax + 1, 0 );
    Vec_IntFill( vFanR, nFaninsMax + 1, 0 );
    Vec_IntFill( vFonR, nFanoutsMax + 1, 0 );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        nFanins  = Vec_IntEntry( vSuppsCo, i );
        Vec_IntAddToEntry( vFan,  nFanins, 1 );
        Vec_IntWriteEntry( vFanR, nFanins, Abc_ObjId(pNode) );
    }
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        nFanouts = Vec_IntEntry( vSuppsCi, i );
        Vec_IntAddToEntry( vFon, nFanouts, 1 );
        Vec_IntWriteEntry( vFonR, nFanouts, Abc_ObjId(pNode) );
    }
    Vec_IntFree( vSuppsCo );
    Vec_IntFree( vSuppsCi );
}